

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O3

void check_openssl(int status)

{
  ulong e;
  runtime_error *this;
  string what;
  char buf [256];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  char local_118 [256];
  
  if (status == 1) {
    ERR_clear_error();
    return;
  }
  memset(local_118,0,0x100);
  e = ERR_get_error();
  ERR_error_string_n(e,local_118,0x100);
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"OpenSSL error: ","");
  std::__cxx11::string::append((char *)local_138);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)local_138);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void
check_openssl(int status)
{
    if (status != 1) {
        // OpenSSL creates a "queue" of errors; copy the first (innermost) error to the exception
        // message.
        char buf[256] = "";
        ERR_error_string_n(ERR_get_error(), buf, sizeof(buf));
        std::string what = "OpenSSL error: ";
        what += buf;
        throw std::runtime_error(what);
    }
    ERR_clear_error();
}